

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::Mangle_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool double_underscores)

{
  string *psVar1;
  string *extraout_RAX;
  bool bVar2;
  CWriter *pCVar3;
  CWriter ch;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool last_was_underscore;
  State state;
  anon_class_24_3_c371f76a append_escaped;
  char local_59;
  undefined1 local_58 [32];
  string *local_38;
  
  local_58._4_4_ = name._M_str._0_4_;
  psVar1 = (string *)local_58;
  local_58._0_4_ = 0;
  local_58._24_8_ = &local_59;
  local_59 = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (CWriter *)0x0) {
    local_58._8_8_ = this + -1;
    pCVar3 = (CWriter *)0x0;
    local_58._16_8_ = __return_storage_ptr__;
    local_38 = psVar1;
    do {
      ch = pCVar3[name._M_len];
      switch(local_58._0_4_) {
      case 0:
        local_58._0_4_ = ZEXT14(ch == (CWriter)0x30);
        break;
      case 1:
        local_58._0_4_ = (uint)(ch == (CWriter)0x78) * 2;
        break;
      case 2:
        bVar5 = (byte)((char)ch - 0x30U) < 10;
        bVar6 = (byte)((char)ch + 0xbfU) < 6;
        bVar2 = bVar6 || bVar5;
        local_58._0_4_ = (uint)bVar2 + (uint)bVar2 * 2;
        if (!bVar6 && !bVar5) break;
        goto LAB_0019374e;
      case 3:
        abort();
      }
      cVar4 = (char)__return_storage_ptr__;
      if (ch == (CWriter)0x5f) {
        if (((CWriter *)local_58._8_8_ == pCVar3 || pCVar3 == (CWriter *)0x0) ||
           (local_59 == '\x01')) {
          ch = (CWriter)0x5f;
          goto LAB_0019374e;
        }
        if (local_58[4] == '\0') goto LAB_0019372e;
        std::__cxx11::string::push_back(cVar4);
        local_59 = '\x01';
        psVar1 = (string *)std::__cxx11::string::push_back(cVar4);
        local_59 = '\x01';
      }
      else {
LAB_0019372e:
        if (((ch == (CWriter)0x5f) || ((byte)((char)ch - 0x30U) < 10)) ||
           ((byte)(((byte)ch & 0xdf) + 0xbf) < 0x1a)) {
          psVar1 = (string *)std::__cxx11::string::push_back(cVar4);
          local_59 = ch == (CWriter)0x5f;
        }
        else {
LAB_0019374e:
          anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()
                    ((anon_class_24_3_c371f76a *)(local_58 + 0x10),(uint8_t)ch);
          psVar1 = extraout_RAX;
        }
      }
      pCVar3 = pCVar3 + 1;
    } while (this != pCVar3);
  }
  return psVar1;
}

Assistant:

std::string CWriter::Mangle(std::string_view name, bool double_underscores) {
  /*
   * Name mangling transforms arbitrary Wasm names into "safe" C names
   * in a deterministic way. To avoid collisions, distinct Wasm names must be
   * transformed into distinct C names.
   *
   * The rules implemented here are:
   * 1) any hex digit ('A' through 'F') that follows the sequence "0x"
   *    is escaped
   * 2) any underscore at the beginning, at the end, or following another
   *    underscore, is escaped
   * 3) if double_underscores is set, underscores are replaced with
   *    two underscores.
   * 4) otherwise, any alphanumeric character is kept as-is,
   *    and any other character is escaped
   *
   * "Escaped" means the character is represented with the sequence "0xAB",
   * where A B are hex digits ('0'-'9' or 'A'-'F') representing the character's
   * numeric value.
   *
   * Module names are mangled with double_underscores=true to prevent
   * collisions between, e.g., a module "alfa" with export
   * "bravo_charlie" vs. a module "alfa_bravo" with export "charlie".
   */

  enum State { Any, Zero, ZeroX, ZeroXHexDigit } state{Any};
  bool last_was_underscore = false;

  std::string result;
  auto append_escaped = [&](const uint8_t ch) {
    result += "0x" + StringPrintf("%02X", ch);
    last_was_underscore = false;
    state = Any;
  };

  auto append_verbatim = [&](const uint8_t ch) {
    result += ch;
    last_was_underscore = (ch == '_');
  };

  for (auto it = name.begin(); it != name.end(); ++it) {
    const uint8_t ch = *it;
    switch (state) {
      case Any:
        state = (ch == '0') ? Zero : Any;
        break;
      case Zero:
        state = (ch == 'x') ? ZeroX : Any;
        break;
      case ZeroX:
        state = internal_ishexdigit(ch) ? ZeroXHexDigit : Any;
        break;
      case ZeroXHexDigit:
        WABT_UNREACHABLE;
        break;
    }

    /* rule 1 */
    if (state == ZeroXHexDigit) {
      append_escaped(ch);
      continue;
    }

    /* rule 2 */
    if ((ch == '_') && ((it == name.begin()) || (std::next(it) == name.end()) ||
                        last_was_underscore)) {
      append_escaped(ch);
      continue;
    }

    /* rule 3 */
    if (double_underscores && ch == '_') {
      append_verbatim(ch);
      append_verbatim(ch);
      continue;
    }

    /* rule 4 */
    if (internal_isalnum(ch) || (ch == '_')) {
      append_verbatim(ch);
    } else {
      append_escaped(ch);
    }
  }

  return result;
}